

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O0

gnode_t * gnode_free(gnode_t *gn,gnode_t *pred)

{
  gnode_t *pgVar1;
  gnode_t *next;
  gnode_t *pred_local;
  gnode_t *gn_local;
  
  pgVar1 = gn->next;
  if (pred != (gnode_t *)0x0) {
    if (pred->next != gn) {
      __assert_fail("pred->next == gn",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/glist.c"
                    ,0x107,"gnode_t *gnode_free(gnode_t *, gnode_t *)");
    }
    pred->next = pgVar1;
  }
  ckd_free(gn);
  return pgVar1;
}

Assistant:

gnode_t *
gnode_free(gnode_t * gn, gnode_t * pred)
{
    gnode_t *next;

    next = gn->next;
    if (pred) {
        assert(pred->next == gn);

        pred->next = next;
    }

    ckd_free((char *) gn);

    return next;
}